

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O0

void __thiscall Prog::Prog(Prog *this,Theme *theme,ALLEGRO_DISPLAY *display)

{
  long in_RDI;
  int i_3;
  List *l_1;
  int i_2;
  List *l;
  int i_1;
  List *image;
  int i;
  List *images [3];
  int in_stack_fffffffffffff398;
  int in_stack_fffffffffffff39c;
  Label *in_stack_fffffffffffff3a0;
  int in_stack_fffffffffffff3a8;
  int in_stack_fffffffffffff3ac;
  int in_stack_fffffffffffff3b0;
  int in_stack_fffffffffffff3b4;
  Widget *in_stack_fffffffffffff3b8;
  Dialog *in_stack_fffffffffffff3c0;
  allocator<char> *in_stack_fffffffffffff3d0;
  char *in_stack_fffffffffffff3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3e0;
  undefined8 in_stack_fffffffffffff408;
  ALLEGRO_DISPLAY *in_stack_fffffffffffff410;
  Theme *in_stack_fffffffffffff418;
  Dialog *in_stack_fffffffffffff420;
  long local_988;
  long local_968;
  long local_948;
  long local_928;
  long local_900;
  long local_8e0;
  long local_8b8;
  int local_748;
  allocator<char> local_741;
  string local_740 [135];
  allocator<char> local_6b9;
  string local_6b8 [135];
  allocator<char> local_631;
  string local_630 [135];
  allocator<char> local_5a9;
  string local_5a8 [39];
  allocator<char> local_581;
  string local_580 [39];
  allocator<char> local_559;
  string local_558 [32];
  long local_538;
  allocator<char> local_529;
  string local_528 [128];
  int local_4a8;
  allocator<char> local_4a1;
  string local_4a0 [39];
  allocator<char> local_479;
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [39];
  allocator<char> local_429;
  string local_428 [39];
  allocator<char> local_401;
  string local_400 [39];
  allocator<char> local_3d9;
  string local_3d8 [39];
  allocator<char> local_3b1;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [32];
  long local_318;
  allocator<char> local_309;
  string local_308 [128];
  int local_288;
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  long local_148;
  int local_13c;
  long local_138 [4];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [56];
  
  Dialog::Dialog(in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410,
                 (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(int)in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
               SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
               SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
               SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
               SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  List::List((List *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c);
  List::List((List *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c);
  List::List((List *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c);
  local_8b8 = in_RDI + 0x2f0;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
                 SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    local_8b8 = local_8b8 + 0x60;
  } while (local_8b8 != in_RDI + 0x530);
  local_8e0 = in_RDI + 0x530;
  do {
    List::List((List *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c);
    local_8e0 = local_8e0 + 0x58;
  } while (local_8e0 != in_RDI + 0x740);
  local_900 = in_RDI + 0x740;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
                 SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
    local_900 = local_900 + 0x60;
  } while (local_900 != in_RDI + 0x860);
  local_928 = in_RDI + 0x860;
  do {
    HSlider::HSlider((HSlider *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c,
                     in_stack_fffffffffffff398);
    local_928 = local_928 + 0x40;
  } while (local_928 != in_RDI + 0x920);
  local_948 = in_RDI + 0x920;
  do {
    HSlider::HSlider((HSlider *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c,
                     in_stack_fffffffffffff398);
    local_948 = local_948 + 0x40;
  } while (local_948 != in_RDI + 0x9e0);
  local_968 = in_RDI + 0x9e0;
  do {
    HSlider::HSlider((HSlider *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c,
                     in_stack_fffffffffffff398);
    local_968 = local_968 + 0x40;
  } while (local_968 != in_RDI + 0xaa0);
  local_988 = in_RDI + 0xaa0;
  do {
    HSlider::HSlider((HSlider *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c,
                     in_stack_fffffffffffff398);
    local_988 = local_988 + 0x40;
  } while (local_988 != in_RDI + 0xb60);
  Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
              in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
              in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
              in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
              in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  local_138[0] = in_RDI + 0x1e8;
  local_138[1] = in_RDI + 0x240;
  local_138[2] = in_RDI + 0x298;
  for (local_13c = 0; local_13c < 3; local_13c = local_13c + 1) {
    local_148 = local_138[local_13c];
    if (local_13c < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      List::append_item((List *)in_stack_fffffffffffff3a0,
                        (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      List::append_item((List *)in_stack_fffffffffffff3a0,
                        (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_191);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      List::append_item((List *)in_stack_fffffffffffff3a0,
                        (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      List::append_item((List *)in_stack_fffffffffffff3a0,
                        (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      List::append_item((List *)in_stack_fffffffffffff3a0,
                        (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator(&local_209);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      List::append_item((List *)in_stack_fffffffffffff3a0,
                        (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator(&local_231);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      List::append_item((List *)in_stack_fffffffffffff3a0,
                        (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator(&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      List::append_item((List *)in_stack_fffffffffffff3a0,
                        (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator(&local_281);
    }
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  }
  for (local_288 = 0; local_288 < 4; local_288 = local_288 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
                 SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
    Label::operator=(in_stack_fffffffffffff3a0,
                     (Label *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    Label::~Label(in_stack_fffffffffffff3a0);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator(&local_309);
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
    local_318 = in_RDI + 0x530 + (long)local_288 * 0x58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator(&local_339);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator(&local_361);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator(&local_389);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator(&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator(&local_429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator(&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator(&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  }
  for (local_4a8 = 4; local_4a8 < 6; local_4a8 = local_4a8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
                 SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
    Label::operator=(in_stack_fffffffffffff3a0,
                     (Label *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    Label::~Label(in_stack_fffffffffffff3a0);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator(&local_529);
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
    local_538 = in_RDI + 0x530 + (long)local_4a8 * 0x58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_558);
    std::allocator<char>::~allocator(&local_559);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_580);
    std::allocator<char>::~allocator(&local_581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    List::append_item((List *)in_stack_fffffffffffff3a0,
                      (string *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    std::__cxx11::string::~string(local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
               SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
  Label::operator=(in_stack_fffffffffffff3a0,
                   (Label *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
  Label::~Label(in_stack_fffffffffffff3a0);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
               SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
  Label::operator=(in_stack_fffffffffffff3a0,
                   (Label *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
  Label::~Label(in_stack_fffffffffffff3a0);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  Label::Label((Label *)in_stack_fffffffffffff3c0,(string *)in_stack_fffffffffffff3b8,
               SUB41((uint)in_stack_fffffffffffff3b4 >> 0x18,0));
  Label::operator=(in_stack_fffffffffffff3a0,
                   (Label *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
  Label::~Label(in_stack_fffffffffffff3a0);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator(&local_741);
  Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
              in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
              in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
              in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  for (local_748 = 0; local_748 < 3; local_748 = local_748 + 1) {
    HSlider::HSlider((HSlider *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c,
                     in_stack_fffffffffffff398);
    HSlider::operator=((HSlider *)in_stack_fffffffffffff3a0,
                       (HSlider *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    HSlider::~HSlider((HSlider *)0x10cd17);
    HSlider::HSlider((HSlider *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c,
                     in_stack_fffffffffffff398);
    HSlider::operator=((HSlider *)in_stack_fffffffffffff3a0,
                       (HSlider *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    HSlider::~HSlider((HSlider *)0x10cd6b);
    HSlider::HSlider((HSlider *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c,
                     in_stack_fffffffffffff398);
    HSlider::operator=((HSlider *)in_stack_fffffffffffff3a0,
                       (HSlider *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    HSlider::~HSlider((HSlider *)0x10cdb9);
    HSlider::HSlider((HSlider *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff39c,
                     in_stack_fffffffffffff398);
    HSlider::operator=((HSlider *)in_stack_fffffffffffff3a0,
                       (HSlider *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    HSlider::~HSlider((HSlider *)0x10ce07);
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
    Dialog::add(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,
                in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8);
  }
  return;
}

Assistant:

Prog::Prog(const Theme & theme, ALLEGRO_DISPLAY *display) :
   d(Dialog(theme, display, 20, 40)),
   memory_label(Label("Memory")),
   texture_label(Label("Texture")),
   source_label(Label("Source", false)),
   destination_label(Label("Destination", false)),
   source_image(List(0)),
   destination_image(List(1)),
   draw_mode(List(0))
{
   d.add(memory_label, 9, 0, 10, 2);
   d.add(texture_label, 0, 0, 10, 2);
   d.add(source_label, 1, 15, 6, 2);
   d.add(destination_label, 7, 15, 6, 2);

   List *images[] = {&source_image, &destination_image, &draw_mode};
   for (int i = 0; i < 3; i++) {
      List & image = *images[i];
      if (i < 2) {
         image.append_item("Mysha");
         image.append_item("Allegro");
         image.append_item("Mysha (tinted)");
         image.append_item("Allegro (tinted)");
         image.append_item("Color");
      }
      else {
         image.append_item("original");
         image.append_item("scaled");
         image.append_item("rotated");
      }
      d.add(image, 1 + i * 6, 16, 4, 6);
   }

   for (int i = 0; i < 4; i++) {
      operation_label[i] = Label(i % 2 == 0 ? "Color" : "Alpha", false);
      d.add(operation_label[i], 1 + i * 3, 23, 3, 2);
      List &l = operations[i];
      l.append_item("ONE");
      l.append_item("ZERO");
      l.append_item("ALPHA");
      l.append_item("INVERSE");
      l.append_item("SRC_COLOR");
      l.append_item("DEST_COLOR");
      l.append_item("INV_SRC_COLOR");
      l.append_item("INV_DEST_COLOR");
      l.append_item("CONST_COLOR");
      l.append_item("INV_CONST_COLOR");
      d.add(l, 1 + i * 3, 24, 3, 10);
   }

   for (int i = 4; i < 6; i++) {
      operation_label[i] = Label(i == 4 ? "Blend op" : "Alpha op", false);
      d.add(operation_label[i], 1 + i * 3, 23, 3, 2);
      List &l = operations[i];
      l.append_item("ADD");
      l.append_item("SRC_MINUS_DEST");
      l.append_item("DEST_MINUS_SRC");
      d.add(l, 1 + i * 3, 24, 3, 6);
   }

   rgba_label[0] = Label("Source tint/color RGBA");
   rgba_label[1] = Label("Dest tint/color RGBA");
   rgba_label[2] = Label("Const color RGBA");
   d.add(rgba_label[0], 1, 34, 5, 1);
   d.add(rgba_label[1], 7, 34, 5, 1);
   d.add(rgba_label[2], 13, 34, 5, 1);

   for (int i = 0; i < 3; i++) {
      r[i] = HSlider(255, 255);
      g[i] = HSlider(255, 255);
      b[i] = HSlider(255, 255);
      a[i] = HSlider(255, 255);
      d.add(r[i], 1 + i * 6, 35, 5, 1);
      d.add(g[i], 1 + i * 6, 36, 5, 1);
      d.add(b[i], 1 + i * 6, 37, 5, 1);
      d.add(a[i], 1 + i * 6, 38, 5, 1);
   }
}